

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeViewPrivate::updateScrollBars(QTreeViewPrivate *this)

{
  QAbstractScrollArea *this_00;
  QWidgetData *pQVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QSize QVar6;
  Representation step;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  
  this_00 = *(QAbstractScrollArea **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  pQVar1 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->data;
  step.m_i = ((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1;
  uVar10 = ((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1;
  bVar12 = (int)(step.m_i | uVar10) < 0;
  if (bVar12) {
    step.m_i = 0;
  }
  uVar11 = (ulong)uVar10;
  if (bVar12) {
    uVar11 = 0;
  }
  if (((this->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
     ((this->super_QAbstractItemViewPrivate).state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this->super_QAbstractItemViewPrivate);
    (**(code **)(**(long **)&(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate
                             .super_QFramePrivate.super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  if ((this->viewItems).d.size == 0) {
    (**(code **)(*(long *)this_00 + 0x220))(this_00);
  }
  iVar4 = (int)uVar11;
  if (this->uniformRowHeights == true) {
    if (this->defaultItemHeight < 1) {
      iVar3 = (int)(this->viewItems).d.size;
    }
    else {
      iVar3 = (int)(uVar11 / (uint)this->defaultItemHeight);
    }
  }
  else {
    iVar8 = (int)(this->viewItems).d.size;
    if (iVar8 < 1) {
      iVar3 = 0;
    }
    else {
      iVar9 = 0;
      iVar7 = 0;
      iVar5 = iVar8;
      do {
        iVar5 = iVar5 + -1;
        iVar3 = itemHeight(this,iVar5);
        iVar9 = iVar3 + iVar9;
        iVar3 = iVar7;
        if (iVar4 < iVar9) break;
        iVar7 = iVar7 + 1;
        iVar3 = iVar8;
      } while (iVar5 != 0);
    }
  }
  if ((this->super_QAbstractItemViewPrivate).verticalScrollMode == ScrollPerItem) {
    lVar2 = (this->viewItems).d.size;
    iVar4 = 1;
    if (1 < iVar3) {
      iVar4 = iVar3;
    }
    if (lVar2 == 0) {
      iVar4 = iVar3;
    }
    QAbstractSlider::setRange
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)->
                super_QAbstractSlider,0,(int)lVar2 - iVar4);
    QAbstractSlider::setPageStep
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)->
                super_QAbstractSlider,iVar4);
    QAbstractSlider::setSingleStep
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)->
                super_QAbstractSlider,1);
  }
  else {
    if (this->uniformRowHeights == false) {
      if ((this->viewItems).d.size == 0) {
        iVar8 = 0;
      }
      else {
        uVar11 = 0;
        iVar8 = 0;
        do {
          iVar5 = itemHeight(this,(int)uVar11);
          iVar8 = iVar8 + iVar5;
          uVar11 = uVar11 + 1;
        } while (uVar11 < (ulong)(this->viewItems).d.size);
      }
    }
    else {
      iVar8 = this->defaultItemHeight * (int)(this->viewItems).d.size;
    }
    QAbstractSlider::setRange
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)->
                super_QAbstractSlider,0,iVar8 - iVar4);
    QAbstractSlider::setPageStep
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)->
                super_QAbstractSlider,iVar4);
    iVar4 = iVar4 / (iVar3 + 1);
    iVar8 = 2;
    if (2 < iVar4) {
      iVar8 = iVar4;
    }
    QAbstractSliderPrivate::itemviewChangeSingleStep
              (*(QAbstractSliderPrivate **)
                &(((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)->
                 super_QAbstractSlider).super_QWidget.field_0x8,iVar8);
  }
  iVar4 = QHeaderView::count(this->header);
  if (iVar4 < 1) {
    iVar8 = 0;
  }
  else {
    iVar5 = 0;
    iVar9 = 0;
    iVar3 = iVar4;
    do {
      iVar3 = iVar3 + -1;
      iVar8 = QHeaderView::logicalIndex(this->header,iVar3);
      iVar8 = QHeaderView::sectionSize(this->header,iVar8);
      iVar5 = iVar8 + iVar5;
      iVar8 = iVar9;
      if (step.m_i < iVar5) break;
      iVar9 = iVar9 + 1;
      iVar8 = iVar4;
    } while (iVar3 != 0);
  }
  iVar3 = iVar8 + (uint)(iVar8 == 0);
  if (iVar4 < 1) {
    iVar3 = iVar8;
  }
  if ((this->super_QAbstractItemViewPrivate).horizontalScrollMode == ScrollPerItem) {
    QAbstractSlider::setRange
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)->
                super_QAbstractSlider,0,iVar4 - iVar3);
    QAbstractSlider::setPageStep
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)->
                super_QAbstractSlider,iVar3);
    QAbstractSlider::setSingleStep
              (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)->
                super_QAbstractSlider,1);
    return;
  }
  iVar4 = QHeaderView::length(this->header);
  QVar6 = QAbstractScrollArea::maximumViewportSize(this_00);
  if ((iVar4 <= QVar6.wd.m_i.m_i) &&
     (iVar8 = QAbstractSlider::maximum
                        (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                          vbar)->super_QAbstractSlider), iVar8 < 1)) {
    step.m_i = QVar6.wd.m_i.m_i;
  }
  QAbstractSlider::setPageStep
            (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)->
              super_QAbstractSlider,step.m_i);
  iVar4 = iVar4 - step.m_i;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  QAbstractSlider::setRange
            (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)->
              super_QAbstractSlider,0,iVar4);
  iVar8 = step.m_i / (iVar3 + 1);
  iVar4 = 2;
  if (2 < iVar8) {
    iVar4 = iVar8;
  }
  QAbstractSliderPrivate::itemviewChangeSingleStep
            (*(QAbstractSliderPrivate **)
              &(((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)->
               super_QAbstractSlider).super_QWidget.field_0x8,iVar4);
  return;
}

Assistant:

void QTreeViewPrivate::updateScrollBars()
{
    Q_Q(QTreeView);
    QSize viewportSize = viewport->size();
    if (!viewportSize.isValid())
        viewportSize = QSize(0, 0);

    executePostedLayout();
    if (viewItems.isEmpty()) {
        q->doItemsLayout();
    }

    int itemsInViewport = 0;
    if (uniformRowHeights) {
        if (defaultItemHeight <= 0)
            itemsInViewport = viewItems.size();
        else
            itemsInViewport = viewportSize.height() / defaultItemHeight;
    } else {
        const int itemsCount = viewItems.size();
        const int viewportHeight = viewportSize.height();
        for (int height = 0, item = itemsCount - 1; item >= 0; --item) {
            height += itemHeight(item);
            if (height > viewportHeight)
                break;
            ++itemsInViewport;
        }
    }
    if (verticalScrollMode == QAbstractItemView::ScrollPerItem) {
        if (!viewItems.isEmpty())
            itemsInViewport = qMax(1, itemsInViewport);
        vbar->setRange(0, viewItems.size() - itemsInViewport);
        vbar->setPageStep(itemsInViewport);
        vbar->setSingleStep(1);
    } else { // scroll per pixel
        int contentsHeight = 0;
        if (uniformRowHeights) {
            contentsHeight = defaultItemHeight * viewItems.size();
        } else { // ### (maybe do like QHeaderView by letting items have startposition)
            for (int i = 0; i < viewItems.size(); ++i)
                contentsHeight += itemHeight(i);
        }
        vbar->setRange(0, contentsHeight - viewportSize.height());
        vbar->setPageStep(viewportSize.height());
        vbar->d_func()->itemviewChangeSingleStep(qMax(viewportSize.height() / (itemsInViewport + 1), 2));
    }

    const int columnCount = header->count();
    const int viewportWidth = viewportSize.width();
    int columnsInViewport = 0;
    for (int width = 0, column = columnCount - 1; column >= 0; --column) {
        int logical = header->logicalIndex(column);
        width += header->sectionSize(logical);
        if (width > viewportWidth)
            break;
        ++columnsInViewport;
    }
    if (columnCount > 0)
        columnsInViewport = qMax(1, columnsInViewport);
    if (horizontalScrollMode == QAbstractItemView::ScrollPerItem) {
        hbar->setRange(0, columnCount - columnsInViewport);
        hbar->setPageStep(columnsInViewport);
        hbar->setSingleStep(1);
    } else { // scroll per pixel
        const int horizontalLength = header->length();
        const QSize maxSize = q->maximumViewportSize();
        if (maxSize.width() >= horizontalLength && vbar->maximum() <= 0)
            viewportSize = maxSize;
        hbar->setPageStep(viewportSize.width());
        hbar->setRange(0, qMax(horizontalLength - viewportSize.width(), 0));
        hbar->d_func()->itemviewChangeSingleStep(qMax(viewportSize.width() / (columnsInViewport + 1), 2));
    }
}